

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererTests::RenderingCompleteCellsRunProducesCells(RendererTests *this)

{
  long lVar1;
  pointer psVar2;
  int iVar3;
  long lVar4;
  int x;
  int cover;
  uint uVar5;
  cell cells [3];
  scanline_mockup sl;
  undefined8 local_c8;
  int aiStack_c0 [10];
  string local_98;
  LocationInfo local_78;
  scanline_mockup local_50;
  
  local_50.excepted_y = -1000000;
  local_50.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._inprogress = true;
  local_50._current_y = 0x7fffffff;
  aiStack_c0[6] = 0;
  local_c8 = 0x1020000000007;
  aiStack_c0[0] = 0;
  aiStack_c0[1] = 0x11;
  aiStack_c0[2] = 0x8e00;
  aiStack_c0[3] = 0;
  aiStack_c0[4] = 0x12;
  aiStack_c0[5] = 0x2600;
  lVar4 = 0;
  x = 7;
  uVar5 = 0;
  do {
    iVar3 = 0;
    do {
      lVar1 = lVar4;
      lVar4 = lVar1 + 0xc;
      iVar3 = iVar3 + *(int *)((long)&local_c8 + lVar1 + 4);
      uVar5 = uVar5 + *(int *)((long)aiStack_c0 + lVar1);
      if (lVar4 == 0x24) break;
    } while (*(int *)((long)aiStack_c0 + lVar1 + 4) == x);
    if (iVar3 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_50,x,uVar5 * 0x200 - iVar3);
      x = x + 1;
    }
    if (lVar4 == 0x24) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_78,&local_98,0x81);
      psVar2 = local_50.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((ut *)&DAT_001a1440,
                 (span (*) [3])
                 local_50.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                  *)local_50.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_finish,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.filename._M_dataplus._M_p != &local_78.filename.field_2) {
        operator_delete(local_78.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (psVar2 != (pointer)0x0) {
        operator_delete(psVar2);
      }
      return;
    }
    iVar3 = *(int *)((long)aiStack_c0 + lVar1 + 4) - x;
    if ((iVar3 != 0) && ((uVar5 & 0x7fffff) != 0)) {
      anon_unknown_1::scanline_mockup::add_span(&local_50,x,iVar3,uVar5 * 0x200);
    }
    x = *(int *)((long)aiStack_c0 + lVar1 + 4);
  } while( true );
}

Assistant:

test( RenderingCompleteCellsRunProducesCells )
			{
				// INIT
				scanline_mockup sl;
				mocks::cell cells[] = { { 7, 129 * 512, 0 }, { 17, 71 * 512, 0 }, { 18, 19 * 512, 0 }, };

				// ACT
				sweep_scanline<8>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference[] = {
					{ 0x7fffffff, 7, 0, -129 * 512 },
					{ 0x7fffffff, 17, 0, -71 * 512 },
					{ 0x7fffffff, 18, 0, -19 * 512 },
				};

				assert_equal(reference, sl.spans_log);
			}